

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debuglink.c
# Opt level: O2

void dwarfstring_list_destructor(dwarfstring_list_s *l)

{
  dwarfstring_list_s *pdVar1;
  dwarfstring_list_s *g;
  
  g = l->dl_next;
  dwarfstring_destructor(&l->dl_string);
  l->dl_next = (dwarfstring_list_s *)0x0;
  while (g != (dwarfstring_list_s *)0x0) {
    pdVar1 = g->dl_next;
    dwarfstring_destructor(&g->dl_string);
    free(g);
    g = pdVar1;
  }
  return;
}

Assistant:

static void
dwarfstring_list_destructor(struct dwarfstring_list_s *l)
{
    struct dwarfstring_list_s *curl = l;
    struct dwarfstring_list_s *nextl = l;

    nextl = curl->dl_next;
    dwarfstring_destructor(&curl->dl_string);
    curl->dl_next = 0;
    curl = nextl;
    for ( ; curl ; curl = nextl) {
        nextl = curl->dl_next;
        dwarfstring_destructor(&curl->dl_string);
        curl->dl_next = 0;
        free(curl);
    }
}